

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall FNodeBuilder::FVertexMap::SelectVertexClose(FVertexMap *this,FPrivVert *vert)

{
  int iVar1;
  uint uVar2;
  FPrivVert *pFVar3;
  int *piVar4;
  TArray<int,_int> *pTVar5;
  uint local_34;
  uint i;
  FPrivVert *vertices;
  TArray<int,_int> *block;
  FPrivVert *vert_local;
  FVertexMap *this_local;
  
  pTVar5 = this->VertexGrid;
  iVar1 = GetBlock(this,(vert->super_FSimpleVert).x,(vert->super_FSimpleVert).y);
  pTVar5 = pTVar5 + iVar1;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->MyBuilder->Vertices,0);
  local_34 = 0;
  do {
    uVar2 = TArray<int,_int>::Size(pTVar5);
    if (uVar2 <= local_34) {
      iVar1 = InsertVertex(this,vert);
      return iVar1;
    }
    piVar4 = TArray<int,_int>::operator[](pTVar5,(ulong)local_34);
    iVar1 = pFVar3[*piVar4].super_FSimpleVert.x - (vert->super_FSimpleVert).x;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 < 6) {
      piVar4 = TArray<int,_int>::operator[](pTVar5,(ulong)local_34);
      iVar1 = pFVar3[*piVar4].super_FSimpleVert.y - (vert->super_FSimpleVert).y;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (iVar1 < 6) {
        piVar4 = TArray<int,_int>::operator[](pTVar5,(ulong)local_34);
        return *piVar4;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int FNodeBuilder::FVertexMap::SelectVertexClose (FNodeBuilder::FPrivVert &vert)
{
	TArray<int> &block = VertexGrid[GetBlock (vert.x, vert.y)];
	FPrivVert *vertices = &MyBuilder.Vertices[0];
	unsigned int i;

	for (i = 0; i < block.Size(); ++i)
	{
#if VERTEX_EPSILON <= 1
		if (vertices[block[i]].x == vert.x && vertices[block[i]].y == vert.y)
#else
		if (abs(vertices[block[i]].x - vert.x) < VERTEX_EPSILON &&
			abs(vertices[block[i]].y - vert.y) < VERTEX_EPSILON)
#endif
		{
			return block[i];
		}
	}

	// Not present: add it!
	return InsertVertex (vert);
}